

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.hpp
# Opt level: O2

ostream * cpp_bindgen::_impl::write_fortran_wrapper<int(std::__cxx11::string_const&)>
                    (ostream *strm,char *fortran_cbindings_name,char *fortran_name)

{
  ostream *poVar1;
  stringstream tmp_strm;
  allocator<char> local_219;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [8];
  string local_1a0 [368];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  fortran_return_type<int,_0>();
  poVar1 = std::operator<<(local_1a8,(string *)&local_218);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,fortran_name);
  std::operator<<(poVar1,"(");
  std::__cxx11::string::~string((string *)&local_218);
  local_218._M_dataplus._M_p = (pointer)local_1b8;
  for_each_param<int(bindgen_fortran_string_descriptor*),cpp_bindgen::_impl::ignore_type_f,cpp_bindgen::_impl::write_fortran_wrapper<int(std::__cxx11::string_const&)>(std::ostream&,char_const*,char_const*)::_lambda(std::__cxx11::string_const&,int)_1_,std::tuple<bindgen_fortran_string_descriptor*>>
            ((ignore_type_f *)&local_1f8,(anon_class_8_1_448b3c02_for_m_fun *)&local_218);
  std::operator<<(local_1a8,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"    ",&local_219);
  wrap_line(&local_218,&local_1f8,&local_1d8);
  std::operator<<(strm,(string *)&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::operator<<(strm,"      use iso_c_binding\n");
  std::operator<<(strm,"      use bindgen_string_descriptor\n");
  local_218._M_dataplus._M_p = (pointer)strm;
  for_each_param<int(std::__cxx11::string_const&),cpp_bindgen::_impl::fortran_param_type_from_cpp_f,cpp_bindgen::_impl::write_fortran_wrapper<int(std::__cxx11::string_const&)>(std::ostream&,char_const*,char_const*)::_lambda(std::__cxx11::string_const&,int)_2_,std::tuple<std::__cxx11::string_const&>>
            ((fortran_param_type_from_cpp_f *)&local_1f8,
             (anon_class_8_1_8991b55a_for_m_fun *)&local_218);
  local_218._M_dataplus._M_p = (pointer)strm;
  for_each_param<int(std::__cxx11::string_const&),cpp_bindgen::_impl::cpp_type_string_descriptor_f,cpp_bindgen::_impl::write_fortran_wrapper<int(std::__cxx11::string_const&)>(std::ostream&,char_const*,char_const*)::_lambda(bool,int)_1_,std::tuple<std::__cxx11::string_const&>>
            ((cpp_type_string_descriptor_f *)&local_1f8,
             (anon_class_8_1_8991b55a_for_m_fun *)&local_218);
  std::operator<<(strm,"\n");
  local_218._M_dataplus._M_p = (pointer)strm;
  for_each_param<int(std::__cxx11::string_const&),cpp_bindgen::_impl::cpp_type_array_descriptor_f,cpp_bindgen::_impl::write_fortran_wrapper<int(std::__cxx11::string_const&)>(std::ostream&,char_const*,char_const*)::_lambda(bindgen_fortran_array_descriptor_const*,int)_2_,std::tuple<std::__cxx11::string_const&>>
            ((cpp_type_array_descriptor_f *)&local_1f8,
             (anon_class_8_1_8991b55a_for_m_fun *)&local_218);
  local_218._M_dataplus._M_p = (pointer)strm;
  for_each_param<int(std::__cxx11::string_const&),cpp_bindgen::_impl::cpp_type_string_descriptor_f,cpp_bindgen::_impl::write_fortran_wrapper<int(std::__cxx11::string_const&)>(std::ostream&,char_const*,char_const*)::_lambda(bool,int)_2_,std::tuple<std::__cxx11::string_const&>>
            ((cpp_type_string_descriptor_f *)&local_1f8,
             (anon_class_8_1_8991b55a_for_m_fun *)&local_218);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"",(allocator<char> *)&local_1f8);
  std::__cxx11::stringbuf::str(local_1a0);
  std::__cxx11::string::~string((string *)&local_218);
  poVar1 = std::operator<<(local_1a8,fortran_name);
  poVar1 = std::operator<<(poVar1," = ");
  poVar1 = std::operator<<(poVar1,fortran_cbindings_name);
  std::operator<<(poVar1,"(");
  local_218._M_dataplus._M_p = (pointer)local_1b8;
  for_each_param<int(std::__cxx11::string_const&),cpp_bindgen::_impl::cpp_type_descriptor_f,cpp_bindgen::_impl::write_fortran_wrapper<int(std::__cxx11::string_const&)>(std::ostream&,char_const*,char_const*)::_lambda(bool,int)_3_,std::tuple<std::__cxx11::string_const&>>
            ((cpp_type_descriptor_f *)&local_1f8,(anon_class_8_1_448b3c02_for_m_fun *)&local_218);
  std::operator<<(local_1a8,")");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"      ",&local_219);
  wrap_line(&local_218,&local_1f8,&local_1d8);
  std::operator<<(strm,(string *)&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  poVar1 = std::operator<<(strm,"    end ");
  fortran_function_specifier<int,_0>();
  std::operator+(&local_218,&local_1f8,"\n");
  poVar1 = std::operator<<(poVar1,(string *)&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return poVar1;
}

Assistant:

std::ostream &write_fortran_wrapper(
            std::ostream &strm, char const *fortran_cbindings_name, const char *fortran_name) {
            using CSignature = wrapped_t<CppSignature>;

            std::stringstream tmp_strm;
            tmp_strm << fortran_return_type<typename function_traits::result_type<CSignature>::type>() << " "
                     << fortran_name << "(";
            for_each_param<CSignature>(ignore_type_f{}, [&](const std::string &, int i) {
                if (i)
                    tmp_strm << ", ";
                tmp_strm << "arg" << i;
            });
            tmp_strm << ")";
            strm << wrap_line(tmp_strm.str(), "    ");

            strm << "      use iso_c_binding\n";
            if (has_array_descriptor<CSignature>::value)
                strm << "      use bindgen_array_descriptor\n";
            if (has_string_descriptor<CSignature>::value)
                strm << "      use bindgen_string_descriptor\n";
            for_each_param<CppSignature>(fortran_param_type_from_cpp_f{}, [&](const std::string &type_name, int i) {
                strm << "      " << type_name << ", target :: arg" << i << "\n";
            });

            for_each_param<CppSignature>(
                cpp_type_array_descriptor_f{}, [&](bindgen_fortran_array_descriptor const *meta, int i) {
                    if (!meta)
                        return;
                    strm << "      type(bindgen_fortran_array_descriptor) :: descriptor" << i << "\n";
                });
            for_each_param<CppSignature>(cpp_type_string_descriptor_f{}, [&](bool is_descr, int i) {
                if (!is_descr)
                    return;
                strm << "      type(bindgen_fortran_string_descriptor) :: descriptor" << i << "\n";
            });
            strm << "\n";

            for_each_param<CppSignature>(
                cpp_type_array_descriptor_f{}, [&](bindgen_fortran_array_descriptor const *meta, int i) {
                    if (!meta)
                        return;
                    const auto var_name = "arg" + std::to_string(i);
                    const auto desc_name = "descriptor" + std::to_string(i);
                    std::string c_loc = "c_loc(" + var_name + "(";
                    for (int i = 0; i < meta->rank; ++i) {
                        if (i)
                            c_loc += ",";
                        c_loc += "lbound(" + var_name + ", " + std::to_string(i + 1) + ")";
                    }
                    c_loc += "))";
                    if (meta->is_acc_present)
                        strm << "      !$acc data present(" << var_name << ")\n"
                             << "      !$acc host_data use_device(" << var_name << ")\n";
                    strm << "      " << desc_name << "%rank = " << meta->rank << "\n"
                         << "      " << desc_name << "%type = " << meta->type << "\n"
                         << "      " << desc_name << "%dims = reshape(shape(" << var_name << "), &\n"
                         << "        shape(" << desc_name << "%dims), (/0/))\n"
                         << "      " << desc_name << "%data = " << c_loc << "\n";
                    if (meta->is_acc_present)
                        strm << "      !$acc end host_data\n"
                             << "      !$acc end data\n";
                    strm << "\n";
                });

            for_each_param<CppSignature>(cpp_type_string_descriptor_f{}, [&](bool is_descr, int i) {
                if (!is_descr)
                    return;
                strm << "      descriptor" << i << "%data = c_loc(arg" << i << ")\n"
                     << "      descriptor" << i << "%size = len(arg" << i << ")\n\n";
            });

            tmp_strm.str("");
            if (std::is_void<typename function_traits::result_type<CSignature>::type>::value) {
                tmp_strm << "call " << fortran_cbindings_name << "(";
            } else {
                tmp_strm << fortran_name << " = " << fortran_cbindings_name << "(";
            }
            for_each_param<CppSignature>(cpp_type_descriptor_f{}, [&](bool is_descriptor, int i) {
                if (i)
                    tmp_strm << ", ";
                tmp_strm << (is_descriptor ? "descriptor" : "arg") << i;
            });
            tmp_strm << ")";
            strm << wrap_line(tmp_strm.str(), "      ");

            return strm << "    end "
                        << fortran_function_specifier<typename function_traits::result_type<CSignature>::type>() + "\n";
        }